

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

void __thiscall
ON_PolylineCurve::ON_PolylineCurve
          (ON_PolylineCurve *this,ON_3dPointArray *points,ON_SimpleArray<double> *params)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int local_30;
  int i;
  ON_SimpleArray<double> *params_local;
  ON_3dPointArray *points_local;
  ON_PolylineCurve *this_local;
  
  ON_Curve::ON_Curve(&this->super_ON_Curve);
  (this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b77288;
  ON_Polyline::ON_Polyline(&this->m_pline);
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_t);
  operator=(this,points);
  iVar2 = ON_SimpleArray<ON_3dPoint>::Count(&points->super_ON_SimpleArray<ON_3dPoint>);
  iVar3 = ON_SimpleArray<double>::Count(params);
  if (iVar2 == iVar3) {
    for (local_30 = 1; iVar2 = ON_SimpleArray<double>::Count(params), local_30 < iVar2;
        local_30 = local_30 + 1) {
      pdVar4 = ON_SimpleArray<double>::operator[](params,local_30 + -1);
      dVar1 = *pdVar4;
      pdVar4 = ON_SimpleArray<double>::operator[](params,local_30);
      if (*pdVar4 <= dVar1) {
        return;
      }
    }
    ON_SimpleArray<double>::operator=(&this->m_t,params);
  }
  return;
}

Assistant:

ON_PolylineCurve::ON_PolylineCurve(const ON_3dPointArray& points, const ON_SimpleArray<double>& params)
{
  *this = points;
  if (points.Count() == params.Count())
  {
    for (int i = 1; i < params.Count(); i++)
    {
      if (params[i-1] >= params[i])
        return;
    }
    m_t = params;
  }
}